

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

int Abc_NtkCountPis(Vec_Ptr_t *vSupp)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  undefined4 local_20;
  undefined4 local_1c;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(vSupp), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vSupp,local_1c);
    iVar1 = Abc_ObjIsPi(pObj_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Abc_NtkCountPis( Vec_Ptr_t * vSupp )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
        Counter += Abc_ObjIsPi(pObj);
    return Counter;
}